

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BackgroundThread.cpp
# Opt level: O0

void __thiscall amrex::BackgroundThread::~BackgroundThread(BackgroundThread *this)

{
  bool bVar1;
  function<void_()> *in_RDI;
  pointer in_stack_ffffffffffffffb8;
  unique_ptr<std::thread,_std::default_delete<std::thread>_> *in_stack_ffffffffffffffc0;
  __uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> in_stack_ffffffffffffffd8;
  BackgroundThread *in_stack_ffffffffffffffe0;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)0x122fa88);
  if (bVar1) {
    in_stack_ffffffffffffffc0 =
         (unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&stack0xffffffffffffffd8;
    std::function<void()>::function<amrex::BackgroundThread::~BackgroundThread()::__0,void>
              (in_RDI,(anon_class_8_1_8991fb9c *)in_RDI);
    Submit(in_stack_ffffffffffffffe0,
           (function<void_()> *)
           in_stack_ffffffffffffffd8._M_t.
           super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
           super__Head_base<0UL,_std::thread_*,_false>._M_head_impl);
    std::function<void_()>::~function((function<void_()> *)0x122fac7);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)0x122fad1);
    std::thread::join();
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::reset
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::~queue((queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
            *)0x122fafa);
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 3));
  std::condition_variable::~condition_variable
            ((condition_variable *)&in_RDI[1].super__Function_base._M_manager);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            (in_stack_ffffffffffffffc0);
  return;
}

Assistant:

BackgroundThread::~BackgroundThread ()
{
    if (m_thread) {
        Submit([this] () { m_finalizing = true; });
        m_thread->join();
        m_thread.reset();
    }
}